

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_TriangleFanSet(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  size_type sVar7;
  DeadlyImportError *pDVar8;
  CX3DImporter_NodeElement_Set *pCVar9;
  reference piVar10;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  byte local_15d;
  value_type_conflict3 local_15c;
  value_type_conflict3 vStack_158;
  bool close_found;
  int local_154;
  value_type_conflict3 local_150;
  value_type_conflict3 local_14c;
  value_type_conflict3 local_148;
  value_type_conflict3 local_144;
  int local_140;
  undefined1 local_13a;
  allocator local_139;
  int32_t vc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_118;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_110;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  const_iterator vc_it;
  size_t coord_num_prev;
  size_t coord_num_first;
  CX3DImporter_NodeElement_Set *ne_alias;
  string local_e0;
  undefined4 local_c0;
  allocator local_b9;
  undefined1 local_b8 [8];
  string an;
  uint local_84;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  undefined1 local_70 [6];
  bool solid;
  bool normalPerVertex;
  vector<int,_std::allocator<int>_> fanCount;
  string local_50 [6];
  bool colorPerVertex;
  bool ccw;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_50);
  fanCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  fanCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_70);
  ne._7_1_ = 1;
  ne._6_1_ = 1;
  _idx_end = (CX3DImporter_NodeElement_Set *)0x0;
  local_84 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_84 < iVar2; local_84 = local_84 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_84);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_b8,(char *)CONCAT44(extraout_var,iVar3),&local_b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_84);
      std::__cxx11::string::operator=(local_50,(char *)CONCAT44(extraout_var_00,iVar3));
      local_c0 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_84);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3))
        ;
        local_c0 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"bboxCenter");
        if (bVar1) {
          local_c0 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,"bboxSize");
          if (bVar1) {
            local_c0 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b8,"containerField");
            if (bVar1) {
              local_c0 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8,"ccw");
              if (bVar1) {
                fanCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ =
                     XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                local_c0 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8,"colorPerVertex");
                if (bVar1) {
                  fanCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._6_1_ =
                       XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                  local_c0 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_b8,"fanCount");
                  if (bVar1) {
                    XML_ReadNode_GetAttrVal_AsArrI32
                              (this,local_84,(vector<int,_std::allocator<int>_> *)local_70);
                    local_c0 = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_b8,"normalPerVertex");
                    if (bVar1) {
                      ne._7_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                      local_c0 = 4;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_b8,"solid");
                      if (bVar1) {
                        ne._6_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                        local_c0 = 4;
                      }
                      else {
                        Throw_IncorrectAttr(this,(string *)local_b8);
                        local_c0 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_b8);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_TriangleFanSet,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_70);
    if (sVar7 == 0) {
      ne_alias._6_1_ = 1;
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,"TriangleFanSet must contain not empty \"fanCount\" attribute."
                 ,(allocator *)((long)&ne_alias + 7));
      DeadlyImportError::DeadlyImportError(pDVar8,&local_e0);
      ne_alias._6_1_ = 0;
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    pCVar9 = (CX3DImporter_NodeElement_Set *)operator_new(0xd8);
    CX3DImporter_NodeElement_Set::CX3DImporter_NodeElement_Set
              (pCVar9,ENET_TriangleFanSet,this->NodeElement_Cur);
    _idx_end = pCVar9;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &(_idx_end->super_CX3DImporter_NodeElement_Geometry3D).
                  super_CX3DImporter_NodeElement.ID,local_50);
    }
    pCVar9 = _idx_end;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).field_0x71 =
         fanCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._7_1_ & 1;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).field_0x72 =
         fanCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._6_1_ & 1;
    std::vector<int,_std::allocator<int>_>::operator=
              (&_idx_end->VertexCount,(vector<int,_std::allocator<int>_> *)local_70);
    (pCVar9->super_CX3DImporter_NodeElement_Geometry3D).field_0x73 = ne._7_1_ & 1;
    (pCVar9->super_CX3DImporter_NodeElement_Geometry3D).Solid = (bool)(ne._6_1_ & 1);
    std::vector<int,_std::allocator<int>_>::clear(&pCVar9->CoordIndex);
    coord_num_prev = 0;
    vc_it._M_current = (int *)0x1;
    local_110._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(&pCVar9->VertexCount);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_108,
               &local_110);
    while( true ) {
      local_118._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end(&pCVar9->VertexCount);
      bVar1 = __gnu_cxx::operator!=(&local_108,&local_118);
      if (!bVar1) break;
      piVar10 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_108);
      if (*piVar10 < 3) {
        local_13a = 1;
        pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&vc,"TriangleFanSet. fanCount shall be greater than or equal to three."
                   ,&local_139);
        DeadlyImportError::DeadlyImportError(pDVar8,(string *)&vc);
        local_13a = 0;
        __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      for (local_140 = 2; iVar2 = local_140,
          piVar10 = __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&local_108), iVar2 < *piVar10; local_140 = local_140 + 1) {
        if ((fanCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._7_1_ & 1) == 0) {
          local_150 = (value_type_conflict3)coord_num_prev;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_150);
          local_154 = (value_type_conflict3)vc_it._M_current + 1;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_154);
          vStack_158 = (value_type_conflict3)vc_it._M_current;
          vc_it._M_current = vc_it._M_current + 1;
          std::vector<int,_std::allocator<int>_>::push_back
                    (&pCVar9->CoordIndex,&stack0xfffffffffffffea8);
        }
        else {
          local_144 = (value_type_conflict3)coord_num_prev;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_144);
          local_148 = (value_type_conflict3)vc_it._M_current;
          vc_it._M_current = vc_it._M_current + 1;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_148);
          local_14c = (value_type_conflict3)vc_it._M_current;
          std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_14c);
        }
        local_15c = -1;
        std::vector<int,_std::allocator<int>_>::push_back(&pCVar9->CoordIndex,&local_15c);
      }
      coord_num_prev = (long)vc_it._M_current + 1;
      vc_it._M_current = vc_it._M_current + 2;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_108);
    }
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((uVar4 & 1) == 0) {
      ParseHelper_Node_Enter(this,(CX3DImporter_NodeElement *)_idx_end);
      local_15d = 0;
      do {
        do {
          while( true ) {
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])
                              ();
            if ((uVar4 & 1) == 0) goto LAB_00b380a5;
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])
                              ();
            if (iVar2 != 1) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_180,"Color",&local_181);
            bVar1 = XML_CheckNode_NameEqual(this,&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            std::allocator<char>::~allocator((allocator<char> *)&local_181);
            if (bVar1) {
              ParseNode_Rendering_Color(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_1a8,"ColorRGBA",&local_1a9);
              bVar1 = XML_CheckNode_NameEqual(this,&local_1a8);
              std::__cxx11::string::~string((string *)&local_1a8);
              std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
              if (bVar1) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_1d0,"Coordinate",&local_1d1);
                bVar1 = XML_CheckNode_NameEqual(this,&local_1d0);
                std::__cxx11::string::~string((string *)&local_1d0);
                std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
                if (bVar1) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_1f8,"Normal",&local_1f9);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_1f8);
                  std::__cxx11::string::~string((string *)&local_1f8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
                  if (bVar1) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_220,"TextureCoordinate",&local_221);
                    bVar1 = XML_CheckNode_NameEqual(this,&local_220);
                    std::__cxx11::string::~string((string *)&local_220);
                    std::allocator<char>::~allocator((allocator<char> *)&local_221);
                    if (bVar1) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar1 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_248,"TriangleFanSet",&local_249);
                        XML_CheckNode_SkipUnsupported(this,&local_248);
                        std::__cxx11::string::~string((string *)&local_248);
                        std::allocator<char>::~allocator((allocator<char> *)&local_249);
                      }
                    }
                  }
                }
              }
            }
          }
          pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                   operator->(&this->mReader);
          iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])()
          ;
        } while (iVar2 != 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_270,"TriangleFanSet",&local_271);
        bVar1 = XML_CheckNode_NameEqual(this,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator((allocator<char> *)&local_271);
      } while (!bVar1);
      local_15d = 1;
LAB_00b380a5:
      if ((local_15d & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_298,"TriangleFanSet",&local_299);
        Throw_CloseNotFound(this,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        std::allocator<char>::~allocator((allocator<char> *)&local_299);
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_TriangleFanSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    std::vector<int32_t> fanCount;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("fanCount", fanCount, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TriangleFanSet, ne);
	}
	else
	{
		// check data
		if(fanCount.size() == 0) throw DeadlyImportError("TriangleFanSet must contain not empty \"fanCount\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Set(CX3DImporter_NodeElement::ENET_TriangleFanSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_Set& ne_alias = *((CX3DImporter_NodeElement_Set*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.VertexCount = fanCount;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;
		// create CoordIdx
		size_t coord_num_first, coord_num_prev;

		ne_alias.CoordIndex.clear();
		// assign indices for first triangle
		coord_num_first = 0;
		coord_num_prev = 1;
		for(std::vector<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); ++vc_it)
		{
			if(*vc_it < 3) throw DeadlyImportError("TriangleFanSet. fanCount shall be greater than or equal to three.");

			for(int32_t vc = 2; vc < *vc_it; vc++)
			{
				if(ccw)
				{
					// 2 1
					//  0
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_first));// first vertex is a center and always is [0].
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev++));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev));
				}
				else
				{
					// 1 2
					//  0
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_first));// first vertex is a center and always is [0].
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev + 1));
					ne_alias.CoordIndex.push_back(static_cast<int32_t>(coord_num_prev++));
				}// if(ccw) else

				ne_alias.CoordIndex.push_back(-1);// add face delimiter.
			}// for(int32_t vc = 2; vc < *vc_it; vc++)

			coord_num_prev++;// that index will be center of next fan
			coord_num_first = coord_num_prev++;// forward to next point - second point of fan
		}// for(std::list<int32_t>::const_iterator vc_it = ne_alias.VertexCount.begin(); vc_it != ne_alias.VertexCount.end(); vc_it++)
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("TriangleFanSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("TriangleFanSet");

			MACRO_NODECHECK_LOOPEND("TriangleFanSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}